

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utMaterialSystem.cpp
# Opt level: O2

void __thiscall
MaterialSystemTest_testIntArrayProperty_Test::TestBody
          (MaterialSystemTest_testIntArrayProperty_Test *this)

{
  undefined4 extraout_EAX;
  int iVar1;
  char *pcVar2;
  uint *pMax_00;
  undefined1 auVar3 [16];
  AssertHelper local_80;
  AssertionResult gtest_ar_;
  AssertHelper local_68;
  uint pMax;
  AssertionResult gtest_ar;
  int local_38 [4];
  
  local_38[0] = 0;
  local_38[1] = 1;
  local_38[2] = 2;
  local_38[3] = 3;
  pMax_00 = &pMax;
  pMax = 4;
  aiMaterial::AddProperty((this->super_MaterialSystemTest).pcMat,local_38,4,"testKey4",0,0);
  local_38[0] = 0xc;
  local_38[1] = 0xc;
  local_38[2] = 0xc;
  local_38[3] = 0xc;
  gtest_ar_._0_8_ = (ulong)(uint)gtest_ar_._4_4_ << 0x20;
  local_80.data_._0_4_ =
       aiGetMaterialIntegerArray
                 ((this->super_MaterialSystemTest).pcMat,"testKey4",0,0,local_38,pMax_00);
  testing::internal::CmpHelperEQ<aiReturn,aiReturn>
            ((internal *)&gtest_ar,"aiReturn_SUCCESS","pcMat->Get(\"testKey4\",0,0,pf,&pMax)",
             (aiReturn *)&gtest_ar_,(aiReturn *)&local_80);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMaterialSystem.cpp"
               ,0x67,pcVar2);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_.success_ = true;
  gtest_ar_._1_7_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)&gtest_ar,"sizeof(pf) / sizeof(int)","pMax",(unsigned_long *)&gtest_ar_,
             &pMax);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMaterialSystem.cpp"
               ,0x68,pcVar2);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  auVar3._0_4_ = -(uint)(local_38[0] == 0);
  auVar3._4_4_ = -(uint)(local_38[1] == 1);
  auVar3._8_4_ = -(uint)(local_38[2] == 2);
  auVar3._12_4_ = -(uint)(local_38[3] == 3);
  iVar1 = movmskps(extraout_EAX,auVar3);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ = iVar1 == 0xf;
  if (iVar1 != 0xf) {
    testing::Message::Message((Message *)&local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,
               (AssertionResult *)"!pf[0] && 1 == pf[1] && 2 == pf[2] && 3 == pf[3]","false","true",
               (char *)pMax_00);
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMaterialSystem.cpp"
               ,0x69,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_80);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  return;
}

Assistant:

TEST_F(MaterialSystemTest, testIntArrayProperty)
{
    int pf[] = {0,1,2,3};
    unsigned int pMax = sizeof(pf) / sizeof(int);
    this->pcMat->AddProperty(pf,pMax,"testKey4");
    pf[0] = pf[1] = pf[2] = pf[3] = 12;

    EXPECT_EQ(AI_SUCCESS, pcMat->Get("testKey4",0,0,pf,&pMax));
    EXPECT_EQ(sizeof(pf) / sizeof(int), pMax);
    EXPECT_TRUE(!pf[0] && 1 == pf[1] && 2 == pf[2] && 3 == pf[3] );
}